

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O3

ir_rvalue * __thiscall
ast_compound_statement::hir
          (ast_compound_statement *this,exec_list *instructions,_mesa_glsl_parse_state *state)

{
  exec_node *peVar1;
  exec_node **ppeVar2;
  
  if (this->new_scope != 0) {
    glsl_symbol_table::push_scope(state->symbols);
  }
  peVar1 = (this->statements).head_sentinel.next;
  ppeVar2 = &peVar1[-3].prev;
  if (ppeVar2 != (exec_node **)0x0 && peVar1->next != (exec_node *)0x0) {
    do {
      (*(code *)(*ppeVar2)->prev)(ppeVar2,instructions,state);
      if (*(long *)ppeVar2[5] == 0) break;
      ppeVar2 = (exec_node **)((long)ppeVar2[5] + -0x28);
    } while (ppeVar2 != (exec_node **)0x0);
  }
  if (this->new_scope != 0) {
    glsl_symbol_table::pop_scope(state->symbols);
  }
  return (ir_rvalue *)0x0;
}

Assistant:

ir_rvalue *
ast_compound_statement::hir(exec_list *instructions,
                            struct _mesa_glsl_parse_state *state)
{
   if (new_scope)
      state->symbols->push_scope();

   foreach_list_typed (ast_node, ast, link, &this->statements)
      ast->hir(instructions, state);

   if (new_scope)
      state->symbols->pop_scope();

   /* Compound statements do not have r-values.
    */
   return NULL;
}